

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.cc
# Opt level: O0

void xemmai::t_fiber::f_run<xemmai::t_debug_context>(void)

{
  t_value<xemmai::t_pointer> *a_arguments;
  t_pvalue *ptVar1;
  pointer ptVar2;
  t_object *this;
  t_fiber *ptVar3;
  long *in_FS_OFFSET;
  t_fiber *p;
  t_rvalue *thrown;
  t_value<xemmai::t_pointer> local_70;
  undefined1 local_60 [8];
  t_debug_context context;
  bool b;
  t_fiber *q;
  t_pvalue x;
  t_pvalue *used;
  
  std::mutex::unlock((mutex *)(in_FS_OFFSET[-5] + 0xc60));
  ptVar1 = f_stack();
  x.field_0.v_integer = (intptr_t)(ptVar1 + -1);
  t_value<xemmai::t_pointer>::t_value
            ((t_value<xemmai::t_pointer> *)&q,(t_value<xemmai::t_pointer> *)x.field_0);
  f_stack__((t_pvalue *)x.field_0);
  a_arguments = *(t_value<xemmai::t_pointer> **)(*(long *)(in_FS_OFFSET[-5] + 0xc90) + 0x10);
  context.v_next._7_1_ = 0;
  t_debug_context::t_debug_context((t_debug_context *)local_60);
  t_value<xemmai::t_slot>::operator()((t_value<xemmai::t_slot> *)&local_70,a_arguments);
  t_value<xemmai::t_pointer>::operator=((t_value<xemmai::t_pointer> *)&q,&local_70);
  ptVar1 = f_stack();
  ptVar2 = std::
           unique_ptr<xemmai::t_value<xemmai::t_pointer>[],_std::default_delete<xemmai::t_value<xemmai::t_pointer>[]>_>
           ::get((unique_ptr<xemmai::t_value<xemmai::t_pointer>[],_std::default_delete<xemmai::t_value<xemmai::t_pointer>[]>_>
                  *)(a_arguments[1].field_0.v_integer + 0x18));
  if (ptVar1 == ptVar2) {
    t_debug_context::~t_debug_context((t_debug_context *)local_60);
    std::mutex::lock((mutex *)(*(long *)(*in_FS_OFFSET + -0x28) + 0xc60));
    *(undefined8 *)(a_arguments[1].field_0.v_integer + 8) = 0;
    a_arguments[1].field_0.v_integer = 0;
    this = t_slot::operator->((t_slot *)(*(long *)(*(long *)(*in_FS_OFFSET + -0x28) + 0xc58) + 8));
    ptVar3 = t_object::f_as<xemmai::t_fiber>(this);
    ptVar3->v_throw = (bool)(context.v_next._7_1_ & 1);
    t_value<xemmai::t_pointer>::operator=(ptVar3->v_return,(t_value<xemmai::t_pointer> *)&q);
    *(t_internal **)(*(long *)(*in_FS_OFFSET + -0x28) + 0xc90) = ptVar3->v_internal;
    f_stack__(ptVar3->v_internal->v_estack_used);
    setcontext(&ptVar3->v_internal->v_context);
    return;
  }
  __assert_fail("f_stack() == q->v_internal->v_estack.get()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/shin1m[P]xemmai/src/fiber.cc"
                ,0xa9,"static void xemmai::t_fiber::f_run() [T_context = xemmai::t_debug_context]");
}

Assistant:

void t_fiber::f_run()
{
	t_thread::v_current->v_mutex.unlock();
	auto used = f_stack() - 1;
	auto x = *used;
	f_stack__(used);
	auto q = t_thread::v_current->v_active->v_fiber;
	auto b = false;
	{
		T_context context;
		try {
			x = q->v_callable(x);
		} catch (const t_rvalue& thrown) {
			q->f_caught(thrown, nullptr);
			b = true;
			x = thrown;
		} catch (...) {
			b = true;
			x = t_throwable::f_instantiate(L"<unexpected>."sv);
		}
		assert(f_stack() == q->v_internal->v_estack.get());
	}
	t_thread::v_current->v_mutex.lock();
	q->v_internal->v_thread = nullptr;
	q->v_internal = nullptr;
	auto& p = t_thread::v_current->v_thread->v_fiber->f_as<t_fiber>();
	p.v_throw = b;
	*p.v_return = x;
	t_thread::v_current->v_active = p.v_internal;
#ifdef __unix__
	f_stack__(p.v_internal->v_estack_used);
	setcontext(&p.v_internal->v_context);
#endif
#ifdef _WIN32
	v_current = p.v_internal;
	SwitchToFiber(p.v_internal->v_handle);
#endif
}